

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O0

void __thiscall cmFileLockPool::PushFunctionScope(cmFileLockPool *this)

{
  ScopePool *this_00;
  ScopePool *local_18;
  cmFileLockPool *local_10;
  cmFileLockPool *this_local;
  
  local_10 = this;
  this_00 = (ScopePool *)operator_new(0x18);
  ScopePool::ScopePool(this_00);
  local_18 = this_00;
  std::vector<cmFileLockPool::ScopePool_*,_std::allocator<cmFileLockPool::ScopePool_*>_>::push_back
            (&this->FunctionScopes,&local_18);
  return;
}

Assistant:

void cmFileLockPool::PushFunctionScope()
{
  this->FunctionScopes.push_back(new ScopePool());
}